

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O0

void __thiscall cmCTestLaunch::WriteXMLAction(cmCTestLaunch *this,cmXMLElement *e2)

{
  bool bVar1;
  ulong uVar2;
  allocator<char> local_139;
  string local_138;
  char *local_118;
  char *outputType;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  string local_c0;
  undefined1 local_a0 [8];
  string source;
  string local_78;
  allocator<char> local_41;
  string local_40;
  cmXMLElement local_20;
  cmXMLElement e3;
  cmXMLElement *e2_local;
  cmCTestLaunch *this_local;
  
  e3.xmlwr = (cmXMLWriter *)e2;
  cmXMLElement::Comment(e2,"Meta-information about the build action");
  cmXMLElement::cmXMLElement(&local_20,(cmXMLElement *)e3.xmlwr,"Action");
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"TargetName",&local_41);
    cmXMLElement::Element<std::__cxx11::string>(&local_20,&local_40,&this->OptionTargetName);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"Language",(allocator<char> *)(source.field_2._M_local_buf + 0xf)
              );
    cmXMLElement::Element<std::__cxx11::string>(&local_20,&local_78,&this->OptionLanguage);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)(source.field_2._M_local_buf + 0xf));
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::string((string *)local_a0,(string *)&this->OptionSource);
    cmsys::SystemTools::ConvertToUnixSlashes((string *)local_a0);
    bVar1 = cmsys::SystemTools::FileIsFullPath(&this->SourceDir);
    if (((bVar1) && (bVar1 = cmsys::SystemTools::FileIsFullPath((string *)local_a0), bVar1)) &&
       (bVar1 = cmsys::SystemTools::IsSubDirectory((string *)local_a0,&this->SourceDir), bVar1)) {
      cmSystemTools::RelativePath(&local_c0,&this->SourceDir,(string *)local_a0);
      std::__cxx11::string::operator=((string *)local_a0,(string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"SourceFile",&local_e1);
    cmXMLElement::Element<std::__cxx11::string>
              (&local_20,&local_e0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
    std::__cxx11::string::~string((string *)local_a0);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"OutputFile",(allocator<char> *)((long)&outputType + 7));
    cmXMLElement::Element<std::__cxx11::string>(&local_20,&local_108,&this->OptionOutput);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator((allocator<char> *)((long)&outputType + 7));
  }
  local_118 = (char *)0x0;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    bVar1 = std::operator==(&this->OptionTargetType,"EXECUTABLE");
    if (bVar1) {
      local_118 = "executable";
    }
    else {
      bVar1 = std::operator==(&this->OptionTargetType,"SHARED_LIBRARY");
      if (bVar1) {
        local_118 = "shared library";
      }
      else {
        bVar1 = std::operator==(&this->OptionTargetType,"MODULE_LIBRARY");
        if (bVar1) {
          local_118 = "module library";
        }
        else {
          bVar1 = std::operator==(&this->OptionTargetType,"STATIC_LIBRARY");
          if (bVar1) {
            local_118 = "static library";
          }
        }
      }
    }
  }
  else {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      local_118 = "object file";
    }
  }
  if (local_118 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"OutputType",&local_139)
    ;
    cmXMLElement::Element<char_const*>(&local_20,&local_138,&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator(&local_139);
  }
  cmXMLElement::~cmXMLElement(&local_20);
  return;
}

Assistant:

void cmCTestLaunch::WriteXMLAction(cmXMLElement& e2)
{
  e2.Comment("Meta-information about the build action");
  cmXMLElement e3(e2, "Action");

  // TargetName
  if (!this->OptionTargetName.empty()) {
    e3.Element("TargetName", this->OptionTargetName);
  }

  // Language
  if (!this->OptionLanguage.empty()) {
    e3.Element("Language", this->OptionLanguage);
  }

  // SourceFile
  if (!this->OptionSource.empty()) {
    std::string source = this->OptionSource;
    cmSystemTools::ConvertToUnixSlashes(source);

    // If file is in source tree use its relative location.
    if (cmSystemTools::FileIsFullPath(this->SourceDir) &&
        cmSystemTools::FileIsFullPath(source) &&
        cmSystemTools::IsSubDirectory(source, this->SourceDir)) {
      source = cmSystemTools::RelativePath(this->SourceDir, source);
    }

    e3.Element("SourceFile", source);
  }

  // OutputFile
  if (!this->OptionOutput.empty()) {
    e3.Element("OutputFile", this->OptionOutput);
  }

  // OutputType
  const char* outputType = nullptr;
  if (!this->OptionTargetType.empty()) {
    if (this->OptionTargetType == "EXECUTABLE") {
      outputType = "executable";
    } else if (this->OptionTargetType == "SHARED_LIBRARY") {
      outputType = "shared library";
    } else if (this->OptionTargetType == "MODULE_LIBRARY") {
      outputType = "module library";
    } else if (this->OptionTargetType == "STATIC_LIBRARY") {
      outputType = "static library";
    }
  } else if (!this->OptionSource.empty()) {
    outputType = "object file";
  }
  if (outputType) {
    e3.Element("OutputType", outputType);
  }
}